

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.h
# Opt level: O0

unique_ptr<std::thread,_std::default_delete<std::thread>_>
tonk::MakeUniqueNoThrow<std::thread,void(tonk::gateway::AsioHost::*)(),tonk::gateway::AsioHost*>
          (type *args,AsioHost **args_1)

{
  void *pvVar1;
  type *in_RDX;
  thread *in_RSI;
  __uniq_ptr_data<std::thread,_std::default_delete<std::thread>,_true,_true> in_RDI;
  pointer in_stack_ffffffffffffffa8;
  _Head_base<0UL,_std::thread_*,_false> this;
  undefined7 in_stack_ffffffffffffffe0;
  
  this._M_head_impl =
       (thread *)
       in_RDI.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
       super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
       super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
  pvVar1 = operator_new(8,(nothrow_t *)&std::nothrow);
  if (pvVar1 != (void *)0x0) {
    std::thread::thread<void(tonk::gateway::AsioHost::*)(),tonk::gateway::AsioHost*,void>
              (in_RSI,in_RDX,(AsioHost **)CONCAT17(1,in_stack_ffffffffffffffe0));
  }
  std::unique_ptr<std::thread,std::default_delete<std::thread>>::
  unique_ptr<std::default_delete<std::thread>,void>
            ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)this._M_head_impl,
             in_stack_ffffffffffffffa8);
  return (__uniq_ptr_data<std::thread,_std::default_delete<std::thread>,_true,_true>)
         (tuple<std::thread_*,_std::default_delete<std::thread>_>)
         in_RDI.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
         super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
         super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
}

Assistant:

inline std::unique_ptr<T> MakeUniqueNoThrow(Args&&... args) {
    return std::unique_ptr<T>(new(std::nothrow) T(std::forward<Args>(args)...));
}